

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

bool __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
::eraseMatch<0ul,capnp::ClientHook*&>
          (Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
           *this,ClientHook **params)

{
  HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> AVar4;
  unsigned_long *pos;
  Entry *local_50;
  ClientHook **local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos741;
  ClientHook **params_local;
  Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
  *this_local;
  
  _pos741.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)params;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>&>
                     ((HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks> *)
                      (this + 0x20));
  AVar4 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::asPtr
                    ((Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)this);
  fwd<capnp::ClientHook*&>((ClientHook **)_pos741.field_1);
  local_50 = AVar4.ptr;
  local_48 = (ClientHook **)AVar4.size_;
  AVar4.size_ = (size_t)local_50;
  AVar4.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>::
  find<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,capnp::ClientHook*&>
            ((HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks> *)&local_40,
             AVar4,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 != (unsigned_long *)0x0) {
    puVar3 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
    ::eraseImpl((Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
                 *)this,*puVar3);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return puVar2 != (unsigned_long *)0x0;
}

Assistant:

bool Table<Row, Indexes...>::eraseMatch(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    eraseImpl(pos);
    return true;
  } else {
    return false;
  }
}